

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O0

Flag<TestConfig> *
anon_unknown.dwarf_421bc::CredentialFlag
          (Flag<TestConfig> *__return_storage_ptr__,Flag<CredentialConfig> *flag)

{
  Flag<CredentialConfig> local_48;
  Flag<CredentialConfig> *local_18;
  Flag<CredentialConfig> *flag_local;
  
  __return_storage_ptr__->name = flag->name;
  __return_storage_ptr__->has_param = (bool)(flag->has_param & 1);
  __return_storage_ptr__->skip_handshaker = false;
  local_18 = flag;
  flag_local = (Flag<CredentialConfig> *)__return_storage_ptr__;
  Flag<CredentialConfig>::Flag(&local_48,flag);
  std::function<bool(TestConfig*,char_const*)>::
  function<(anonymous_namespace)::CredentialFlag((anonymous_namespace)::Flag<CredentialConfig>)::__0,void>
            ((function<bool(TestConfig*,char_const*)> *)&__return_storage_ptr__->set_param,
             (anon_class_48_1_898bac6a *)&local_48);
  (anonymous_namespace)::CredentialFlag((anonymous_namespace)::Flag<CredentialConfig>)::$_0::~__0
            ((__0 *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

Flag<TestConfig> CredentialFlag(Flag<CredentialConfig> flag) {
  return Flag<TestConfig>{flag.name, flag.has_param, /*skip_handshaker=*/false,
                          [=](TestConfig *config, const char *param) -> bool {
                            if (config->credentials.empty()) {
                              fprintf(stderr, "No credentials configured.\n");
                              return false;
                            }
                            return flag.set_param(&config->credentials.back(),
                                                  param);
                          }};
}